

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkServerTest.cpp
# Opt level: O3

void __thiscall MyServerConnection::OnConnect(MyServerConnection *this)

{
  ostringstream *this_00;
  OutputWorker *this_01;
  pointer psVar1;
  MyServerConnection *this_02;
  undefined1 auVar2 [64];
  vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
  connections;
  TonkStatus status;
  uint8_t incompressible_a [100];
  uint8_t incompressible_b [200];
  vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
  local_258;
  TonkStatus local_240;
  TonkStatus local_228;
  undefined8 uStack_210;
  char acStack_208 [32];
  undefined1 local_1e8 [48];
  undefined1 auStack_1b8 [128];
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_100;
  undefined1 local_f8 [64];
  
  test::LogTonkStatus(&this->super_SDKConnection);
  tonk::SDKConnection::GetStatus(&local_240,&this->super_SDKConnection);
  tonk::SDKConnectionList<MyServerConnection>::GetList(&local_258,&this->Server->ConnectionList);
  if (local_258.
      super__Vector_base<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_258.
      super__Vector_base<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this_00 = (ostringstream *)(auStack_1b8 + 0x10);
    psVar1 = local_258.
             super__Vector_base<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      tonk::SDKConnection::GetStatus
                (&local_228,
                 &((psVar1->super___shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->super_SDKConnection);
      auVar2 = _local_1e8;
      this_02 = (psVar1->super___shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (this_02 != this) {
        if ((int)Logger.ChannelMinLevel < 3) {
          auStack_1b8._0_8_ = Logger.ChannelName;
          auStack_1b8._12_4_ = auVar2._60_4_;
          auStack_1b8._8_4_ = 2;
          std::__cxx11::ostringstream::ostringstream(this_00);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,Logger.Prefix._M_dataplus._M_p,
                     Logger.Prefix._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,"Broadcasting connection ",0x18);
          std::ostream::_M_insert<unsigned_long>((ulong)this_00);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," about ",7);
          std::ostream::_M_insert<unsigned_long>((ulong)this_00);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," connecting",0xb);
          this_01 = logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(this_01,(LogStringBuffer *)auStack_1b8);
          std::__cxx11::ostringstream::~ostringstream(this_00);
          std::ios_base::~ios_base((ios_base *)&local_138);
          this_02 = (psVar1->super___shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr;
        }
        auVar2 = _local_1e8;
        auStack_1b8[0] = 3;
        auStack_1b8._5_11_ = auVar2._53_11_;
        auStack_1b8._1_4_ = local_240.LocallyAssignedIdForRemoteHost;
        tonk::SDKConnection::Send
                  (&this_02->super_SDKConnection,(LogStringBuffer *)auStack_1b8,5,0x32);
      }
      auVar2 = _local_1e8;
      auStack_1b8[0] = 3;
      auStack_1b8._5_11_ = auVar2._53_11_;
      auStack_1b8._1_4_ = local_228.LocallyAssignedIdForRemoteHost;
      tonk::SDKConnection::Send(&this->super_SDKConnection,(LogStringBuffer *)auStack_1b8,5,0x32);
      psVar1 = psVar1 + 1;
    } while (psVar1 != local_258.
                       super__Vector_base<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  auVar2 = vmovdqa64_avx512f(ram0x0010b080);
  local_228.Flags = 0x3020100;
  local_228.LocallyAssignedIdForRemoteHost = 0x7060504;
  local_228.AppBPS = 0xb0a0908;
  local_228.ReliableQueueMsec = 0xf0e0d0c;
  local_228.LowPriQueueMsec = 0x13121110;
  local_228.TimerIntervalUsec = 0x17161514;
  uStack_210 = 0x1f1e1d1c1b1a1918;
  builtin_strncpy(acStack_208," !\"#$%&\'()*+,-./0123456789:;<=>?",0x20);
  auVar2 = vmovdqu8_avx512bw(auVar2);
  local_1e8 = auVar2._0_48_;
  auStack_1b8._0_8_ = 0xc1c2c3c4c5c6c7c8;
  auStack_1b8._8_8_ = 0xb9babbbcbdbebfc0;
  auStack_1b8._16_8_ = 0xb1b2b3b4b5b6b7b8;
  auStack_1b8._24_8_ = 0xa9aaabacadaeafb0;
  auStack_1b8._32_8_ = 0xa1a2a3a4a5a6a7a8;
  auStack_1b8._40_8_ = 0x999a9b9c9d9e9fa0;
  auStack_1b8._48_8_ = 0x9192939495969798;
  auStack_1b8._56_8_ = 0x898a8b8c8d8e8f90;
  auStack_1b8._64_8_ = 0x8182838485868788;
  auStack_1b8._72_8_ = 0x797a7b7c7d7e7f80;
  auStack_1b8._80_8_ = 0x7172737475767778;
  auStack_1b8._88_8_ = 0x696a6b6c6d6e6f70;
  auStack_1b8._96_8_ = 0x6162636465666768;
  auStack_1b8._104_8_ = 0x595a5b5c5d5e5f60;
  auStack_1b8._112_8_ = 0x5152535455565758;
  auStack_1b8._120_8_ = 0x494a4b4c4d4e4f50;
  auVar2 = vpbroadcastq_avx512f(ZEXT816(0x102030405060708));
  local_138 = 0x4142434445464748;
  uStack_130 = 0x393a3b3c3d3e3f40;
  uStack_128 = 0x3132333435363738;
  uStack_120 = 0x292a2b2c2d2e2f30;
  uStack_118 = 0x2122232425262728;
  uStack_110 = 0x191a1b1c1d1e1f20;
  uStack_108 = 0x1112131415161718;
  uStack_100 = 0x90a0b0c0d0e0f10;
  local_f8 = vmovdqu8_avx512bw(auVar2);
  tonk::SDKConnection::Send(&this->super_SDKConnection,&local_228,100,0x9b);
  tonk::SDKConnection::Send(&this->super_SDKConnection,auStack_1b8,200,0x37);
  std::
  vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
  ::~vector(&local_258);
  return;
}

Assistant:

void MyServerConnection::OnConnect()
{
    LogTonkStatus(this);

    TonkStatus status = GetStatus();

    auto connections = Server->ConnectionList.GetList();
    for (auto& connection : connections)
    {
        TonkStatus cs = connection->GetStatus();

        if (connection.get() != this)
        {
            Logger.Info("Broadcasting connection ", cs.LocallyAssignedIdForRemoteHost,
                " about ", status.LocallyAssignedIdForRemoteHost, " connecting");

            uint8_t data[1 + 4];
            data[0] = ID_ConnectionAdded;
            tonk::WriteU32_LE(data + 1, status.LocallyAssignedIdForRemoteHost);
            connection->Send(data, sizeof(data), TonkChannel_Reliable0);
        }

        uint8_t data[1 + 4];
        data[0] = ID_ConnectionAdded;
        tonk::WriteU32_LE(data + 1, cs.LocallyAssignedIdForRemoteHost);
        Send(data, sizeof(data), TonkChannel_Reliable0);
    }

    // Send two buffers in quick succession in unused channels.
    // The goal is to get the Flush() function to insert a sync
    // frame between these two buffers to test this rare case.
    static const int kBytesA = 100;
    static const int kBytesB = 200;
    uint8_t incompressible_a[kBytesA];
    uint8_t incompressible_b[kBytesB];
    for (int i = 0; i < kBytesA; ++i) {
        incompressible_a[i] = (uint8_t)(i);
    }
    for (int i = 0; i < kBytesB; ++i) {
        incompressible_b[i] = (uint8_t)(kBytesB - i);
    }
    Send(incompressible_a, kBytesA, TonkChannel_LowPri0 + 5);
    Send(incompressible_b, kBytesB, TonkChannel_Reliable0 + 5);
}